

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O3

void __thiscall kratos::IfStmt::~IfStmt(IfStmt *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002ba3f8;
  p_Var1 = (this->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->predicate_stmt_).
           super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

explicit IfStmt(Var &var) : IfStmt(var.shared_from_this()) {}